

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

string * __thiscall
google::protobuf::Join<google::protobuf::RepeatedField<int>>
          (string *__return_storage_ptr__,protobuf *this,RepeatedField<int> *components,char *delim)

{
  const_iterator start;
  const_iterator end;
  char *delim_local;
  RepeatedField<int> *components_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  start = RepeatedField<int>::begin((RepeatedField<int> *)this);
  end = RepeatedField<int>::end((RepeatedField<int> *)this);
  Join<int_const*>(start,end,(char *)components,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Join(const Range& components,
            const char* delim) {
  string result;
  Join(components.begin(), components.end(), delim, &result);
  return result;
}